

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.hpp
# Opt level: O3

ostream * dump_properties<std::deque<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>>
                    (ostream *os,
                    deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *properties)

{
  _Elt_pointer ppVar1;
  ostream *os_00;
  _Elt_pointer ppVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *property;
  _Elt_pointer property_00;
  _Map_pointer pppVar3;
  size_type *local_50;
  string sep;
  
  local_50 = &sep._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  property_00 = (properties->
                super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar1 = (properties->
           super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (property_00 != ppVar1) {
    ppVar2 = (properties->
             super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start._M_last;
    pppVar3 = (properties->
              super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      os_00 = std::__ostream_insert<char,std::char_traits<char>>
                        (os,(char *)local_50,(long)sep._M_dataplus._M_p);
      operator<<(os_00,property_00);
      std::__cxx11::string::_M_replace((ulong)&local_50,0,sep._M_dataplus._M_p,0x122662);
      property_00 = property_00 + 1;
      if (property_00 == ppVar2) {
        property_00 = pppVar3[1];
        pppVar3 = pppVar3 + 1;
        ppVar2 = property_00 + 8;
      }
    } while (property_00 != ppVar1);
  }
  if (local_50 != &sep._M_string_length) {
    operator_delete(local_50,sep._M_string_length + 1);
  }
  return os;
}

Assistant:

std::ostream &dump_properties(std::ostream &os, const T &properties) {
  string sep = "";
  for (const auto &property : properties) {
    os << sep << property;
    sep = ",";
  }
  return os;
}